

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O0

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::Controller(Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
             *this,function<void_(unsigned_long)> *tempo,
            function<void_(ableton::link::Tempo)> *peerCallback,
            function<void_(ableton::link::Tempo)> *tempoCallback,
            Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
            *param_5)

{
  long lVar1;
  microseconds mVar2;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *pCVar3;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *t;
  GhostXForm GVar4;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> local_1b8;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  local_198;
  GatewayFactory local_178;
  NodeState local_170;
  pair<ableton::link::NodeState,_ableton::link::GhostXForm> local_148;
  util local_108 [8];
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *local_100;
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *local_f8;
  util local_f0 [8];
  NodeIdArray local_e8;
  double local_e0;
  long lStack_d8;
  rep local_d0;
  double local_c8;
  rep rStack_c0;
  rep local_b8;
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *local_b0;
  SessionPeerCounter *local_a8;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
  local_a0;
  function<void_(unsigned_long)> local_98;
  int local_78 [2];
  microseconds local_70;
  int local_64;
  undefined1 local_60 [40];
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *local_38;
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *io_local;
  function<void_(ableton::link::Tempo)> *tempoCallback_local;
  function<void_(unsigned_long)> *peerCallback_local;
  Tempo *tempo_local;
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  *this_local;
  
  local_38 = param_5;
  io_local = (Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
              *)tempoCallback;
  tempoCallback_local = peerCallback;
  peerCallback_local = tempo;
  tempo_local = (Tempo *)this;
  std::function<void_(ableton::link::Tempo)>::function(&this->mTempoCallback,tempoCallback);
  lVar1 = NodeId::random();
  *(long *)(this->mNodeId).super_NodeIdArray._M_elems = lVar1;
  *(undefined8 *)(this->mSessionId).super_NodeIdArray._M_elems =
       *(undefined8 *)(this->mNodeId).super_NodeIdArray._M_elems;
  std::mutex::mutex(&this->mSessionTimingGuard);
  GVar4 = detail::initXForm<ableton::platforms::linux::Clock<1>>((Clock<1> *)&this->field_0x20);
  (this->mGhostXForm).slope = GVar4.slope;
  (this->mGhostXForm).intercept.__r = GVar4.intercept.__r.__r;
  local_60._0_8_ = *(undefined8 *)&(tempo->super__Function_base)._M_functor;
  Beats::Beats((Beats *)(local_60 + 8),0.0);
  local_64 = 0;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000l>> *)(local_60 + 0x10),&local_64);
  clampTempo(&this->mSessionTimeline,(Timeline *)local_60);
  std::mutex::mutex(&this->mClientTimelineGuard);
  (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  Beats::Beats(&(this->mClientTimeline).beatOrigin,0.0);
  local_78[1] = 0;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&local_70,local_78 + 1);
  mVar2 = GhostXForm::ghostToHost(&this->mGhostXForm,local_70);
  (this->mClientTimeline).timeOrigin.__r = mVar2.__r;
  (this->mRtClientTimeline).timeOrigin.__r = (this->mClientTimeline).timeOrigin.__r;
  lVar1 = (this->mClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
          super__Head_base<0UL,_long,_false>._M_head_impl;
  (this->mRtClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (this->mClientTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->mRtClientTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar1;
  local_78[0] = 0;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&this->mRtClientTimelineTimestamp,local_78);
  std::function<void_(unsigned_long)>::function
            (&local_98,(function<void_(unsigned_long)> *)peerCallback);
  SessionPeerCounter::SessionPeerCounter(&this->mSessionPeerCounter,this,&local_98);
  std::function<void_(unsigned_long)>::~function(&local_98);
  std::atomic<bool>::atomic(&this->mEnabled,false);
  ableton::util::
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::Injected(&this->mIo,param_5);
  RtTimelineSetter::RtTimelineSetter(&this->mRtTimelineSetter,this);
  pCVar3 = ableton::util::
           Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
           ::operator*(&this->mIo);
  ableton::util::
  injectRef<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>
            ((util *)&local_a0,pCVar3);
  local_a8 = (SessionPeerCounter *)
             std::
             ref<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>
                       (&this->mSessionPeerCounter);
  local_b0 = this;
  Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
  ::Peers(&this->mPeers,&local_a0,
          (reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>
           )local_a8,(SessionTimelineCallback)this);
  local_e8._M_elems = *&(this->mSessionId).super_NodeIdArray._M_elems;
  local_d0 = (this->mSessionTimeline).timeOrigin.__r;
  local_e0 = (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
             super__Head_base<0UL,_double,_false>._M_head_impl;
  lStack_d8 = (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
              super__Head_base<0UL,_long,_false>._M_head_impl;
  local_c8 = (this->mGhostXForm).slope;
  rStack_c0 = (this->mGhostXForm).intercept.__r;
  local_b8 = (rep)ableton::platforms::linux::Clock<1>::micros((Clock<1> *)&this->field_0x20);
  ableton::util::
  injectRef<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>>
            (local_f0,&this->mPeers);
  local_100 = this;
  local_f8 = this;
  pCVar3 = ableton::util::
           Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
           ::operator*(&this->mIo);
  ableton::util::
  injectRef<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>
            (local_108,pCVar3);
  Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
  ::Sessions(&this->mSessions,&local_e8,local_f0,local_f8,local_100,local_108);
  local_170.nodeId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(this->mNodeId).super_NodeIdArray._M_elems;
  local_170.sessionId.super_NodeIdArray._M_elems =
       *(NodeIdArray *)(this->mSessionId).super_NodeIdArray._M_elems;
  local_170.timeline.timeOrigin.__r = (this->mSessionTimeline).timeOrigin.__r;
  local_170.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (this->mSessionTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_170.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (this->mSessionTimeline).beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  std::make_pair<ableton::link::NodeState,ableton::link::GhostXForm&>
            (&local_148,&local_170,&this->mGhostXForm);
  local_178.mController = this;
  pCVar3 = ableton::util::
           Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
           ::operator->(&this->mIo);
  ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>
  ::
  clone<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::UdpSendExceptionHandler>
            (&local_1b8,
             (Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)pCVar3,
             (UdpSendExceptionHandler)this);
  ableton::util::
  injectVal<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>
            (&local_198,(util *)&local_1b8,t);
  discovery::
  Service<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::Service(&this->mDiscovery,&local_148,local_178,&local_198);
  ableton::util::
  Injected<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::~Injected(&local_198);
  ableton::platforms::asio::
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>::~Context(&local_1b8);
  return;
}

Assistant:

Controller(Tempo tempo,
    PeerCountCallback peerCallback,
    TempoCallback tempoCallback,
    Clock clock,
    util::Injected<IoContext> io)
    : mTempoCallback(std::move(tempoCallback))
    , mClock(std::move(clock))
    , mNodeId(NodeId::random())
    , mSessionId(mNodeId)
    , mGhostXForm(detail::initXForm(mClock))
    , mSessionTimeline(clampTempo({tempo, Beats{0.}, std::chrono::microseconds{0}}))
    , mClientTimeline({mSessionTimeline.tempo, Beats{0.},
        mGhostXForm.ghostToHost(std::chrono::microseconds{0})})
    , mRtClientTimeline(mClientTimeline)
    , mRtClientTimelineTimestamp(0)
    , mSessionPeerCounter(*this, std::move(peerCallback))
    , mEnabled(false)
    , mIo(std::move(io))
    , mRtTimelineSetter(*this)
    , mPeers(util::injectRef(*mIo),
        std::ref(mSessionPeerCounter),
        SessionTimelineCallback{*this})
    , mSessions({mSessionId, mSessionTimeline, {mGhostXForm, mClock.micros()}},
        util::injectRef(mPeers),
        MeasurePeer{*this},
        JoinSessionCallback{*this},
        util::injectRef(*mIo),
        mClock)
    , mDiscovery(
        std::make_pair(NodeState{mNodeId, mSessionId, mSessionTimeline}, mGhostXForm),
        GatewayFactory{*this},
        util::injectVal(mIo->clone(UdpSendExceptionHandler{*this})))
  {
  }